

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O3

void __thiscall OpenMD::HBondJumpZ::findHBonds(HBondJumpZ *this,int frame)

{
  double *pdVar1;
  int iVar2;
  int index;
  HBondDonor *pHVar3;
  Atom *pAVar4;
  _func_int **pp_Var5;
  long lVar6;
  bool bVar7;
  Molecule *pMVar8;
  long lVar9;
  pointer ppAVar10;
  long lVar11;
  long lVar12;
  pointer ppHVar13;
  MoleculeIterator mj;
  MoleculeIterator mi;
  Vector3d pos;
  Mat3x3d hmat;
  MoleculeIterator local_1e0;
  MoleculeIterator local_1d8;
  double local_1d0;
  pointer local_1c8;
  Atom *local_1c0;
  Vector3d local_1b8;
  double local_198;
  double dStack_190;
  double local_188;
  Molecule *local_180;
  double local_178;
  double dStack_170;
  double local_168;
  double local_158;
  double dStack_150;
  double local_148;
  Vector3d local_138;
  Vector3d local_118;
  Vector3d local_f8;
  Vector3d local_d8;
  Vector3d local_b8;
  Vector3d local_98;
  Mat3x3d local_78;
  
  local_1d8._M_node = (_Base_ptr)0x0;
  local_1e0._M_node = (_Base_ptr)0x0;
  local_1b8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1b8.super_Vector<double,_3U>.data_[1] = 0.0;
  Snapshot::getHmat(&local_78,(this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_);
  local_1d0 = *(double *)
               ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
               + (ulong)(uint)this->axis_ * 0x20);
  pMVar8 = SimInfo::beginMolecule
                     ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1d8);
  if (pMVar8 != (Molecule *)0x0) {
    do {
      ppHVar13 = (pMVar8->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (ppHVar13 !=
          (pMVar8->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pHVar3 = *ppHVar13;
        while (pHVar3 != (HBondDonor *)0x0) {
          ppHVar13 = ppHVar13 + 1;
          (*(this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
            _vptr_DynamicProperty[0x14])
                    (this,(ulong)(uint)frame,
                     (ulong)(uint)(pHVar3->donatedHydrogen->super_StuntDouble).globalIndex_);
          if (ppHVar13 ==
              (pMVar8->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) break;
          pHVar3 = *ppHVar13;
        }
      }
      pMVar8 = SimInfo::nextMolecule
                         ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1d8);
    } while (pMVar8 != (Molecule *)0x0);
  }
  local_180 = SimInfo::beginMolecule
                        ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1d8);
  if (local_180 != (Molecule *)0x0) {
    local_1d0 = local_1d0 * 0.5;
    do {
      ppAVar10 = (pointer)(local_180->hBondDonors_).
                          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar10 !=
          (pointer)(local_180->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pAVar4 = *ppAVar10;
          if (pAVar4 == (Atom *)0x0) break;
          pp_Var5 = (pAVar4->super_StuntDouble)._vptr_StuntDouble;
          local_1c0 = (Atom *)(long)*(int *)(*(long *)&(pAVar4->super_StuntDouble).objType_ + 0x28);
          iVar2 = *(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[frame].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + (long)local_1c0 * 4);
          local_148 = *(double *)
                       (*(long *)(pp_Var5[2] + *(long *)(pp_Var5[3] + 0x18)) + 0x10 +
                       (long)*(int *)(pp_Var5 + 6) * 0x18);
          pdVar1 = (double *)
                   (*(long *)(pp_Var5[2] + *(long *)(pp_Var5[3] + 0x18)) +
                   (long)*(int *)(pp_Var5 + 6) * 0x18);
          local_158 = *pdVar1;
          dStack_150 = pdVar1[1];
          lVar6 = *(long *)&(pAVar4->super_StuntDouble).objType_;
          lVar12 = *(long *)(*(long *)(*(long *)(lVar6 + 0x18) + 0x18) + *(long *)(lVar6 + 0x10));
          local_188 = *(double *)(lVar12 + 0x10 + (long)*(int *)(lVar6 + 0x30) * 0x18);
          pdVar1 = (double *)(lVar12 + (long)*(int *)(lVar6 + 0x30) * 0x18);
          local_198 = *pdVar1;
          dStack_190 = pdVar1[1];
          local_1e0._M_node = local_1d8._M_node;
          local_1c8 = ppAVar10;
          pMVar8 = SimInfo::beginMolecule
                             ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e0);
          while (pMVar8 != (Molecule *)0x0) {
            ppAVar10 = (pMVar8->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (ppAVar10 !=
                (pMVar8->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar4 = *ppAVar10;
              while (pAVar4 != (Atom *)0x0) {
                ppAVar10 = ppAVar10 + 1;
                lVar12 = (long)(pAVar4->super_StuntDouble).localIndex_;
                lVar6 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).position.
                                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                 (pAVar4->super_StuntDouble).storage_);
                local_168 = *(double *)(lVar6 + 0x10 + lVar12 * 0x18);
                pdVar1 = (double *)(lVar6 + lVar12 * 0x18);
                local_178 = *pdVar1;
                dStack_170 = pdVar1[1];
                pdVar1 = (double *)(lVar6 + lVar12 * 0x18);
                local_d8.super_Vector<double,_3U>.data_[0] = *pdVar1;
                local_d8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
                local_d8.super_Vector<double,_3U>.data_[2] =
                     *(double *)(lVar6 + 0x10 + lVar12 * 0x18);
                local_b8.super_Vector<double,_3U>.data_[0] = local_198;
                local_b8.super_Vector<double,_3U>.data_[1] = dStack_190;
                local_b8.super_Vector<double,_3U>.data_[2] = local_188;
                local_98.super_Vector<double,_3U>.data_[0] = local_158;
                local_98.super_Vector<double,_3U>.data_[1] = dStack_150;
                local_98.super_Vector<double,_3U>.data_[2] = local_148;
                bVar7 = HBondJump::isHBond(&this->super_HBondJump,&local_98,&local_b8,&local_d8);
                if (bVar7) {
                  HBondJump::registerHydrogenBond
                            (&this->super_HBondJump,frame,iVar2,(int)local_1c0,
                             (pAVar4->super_StuntDouble).globalIndex_);
                  local_1b8.super_Vector<double,_3U>.data_[2] = local_188;
                  local_1b8.super_Vector<double,_3U>.data_[0] = local_198;
                  local_1b8.super_Vector<double,_3U>.data_[1] = dStack_190;
                  if ((((this->super_HBondJump).super_TimeCorrFunc<double>.info_)->simParams_->
                      UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
                    Snapshot::wrapVector
                              ((this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_,
                               &local_1b8);
                  }
                  *(int *)(*(long *)&(this->zbin_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[frame].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + (long)iVar2 * 4) =
                       (int)(((local_1b8.super_Vector<double,_3U>.data_[(uint)this->axis_] +
                              local_1d0) * (double)this->nZBins_) /
                            *(double *)
                             ((long)local_78.super_SquareMatrix<double,_3>.
                                    super_RectMatrix<double,_3U,_3U>.data_ +
                             (ulong)(uint)this->axis_ * 0x20));
                }
                if (ppAVar10 ==
                    (pMVar8->hBondAcceptors_).
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_finish) break;
                pAVar4 = *ppAVar10;
              }
            }
            pMVar8 = SimInfo::nextMolecule
                               ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e0)
            ;
          }
          ppAVar10 = local_1c8 + 1;
        } while (ppAVar10 !=
                 (pointer)(local_180->hBondDonors_).
                          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      ppAVar10 = (local_180->hBondAcceptors_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      while ((ppAVar10 !=
              (local_180->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish && (pAVar4 = *ppAVar10, pAVar4 != (Atom *)0x0))) {
        lVar12 = (long)(pAVar4->super_StuntDouble).localIndex_;
        lVar6 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                 atomData).position.
                                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                         (pAVar4->super_StuntDouble).storage_);
        local_168 = *(double *)(lVar6 + 0x10 + lVar12 * 0x18);
        pdVar1 = (double *)(lVar6 + lVar12 * 0x18);
        local_178 = *pdVar1;
        dStack_170 = pdVar1[1];
        local_1e0._M_node = local_1d8._M_node;
        local_1c8 = ppAVar10;
        local_1c0 = pAVar4;
        pMVar8 = SimInfo::beginMolecule
                           ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e0);
        while (pMVar8 != (Molecule *)0x0) {
          ppHVar13 = (pMVar8->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppHVar13 !=
              (pMVar8->hBondDonors_).
              super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pHVar3 = *ppHVar13;
            while (pHVar3 != (HBondDonor *)0x0) {
              ppHVar13 = ppHVar13 + 1;
              pAVar4 = pHVar3->donorAtom;
              iVar2 = (pHVar3->donatedHydrogen->super_StuntDouble).globalIndex_;
              index = *(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[frame].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data + (long)iVar2 * 4);
              lVar11 = (long)(pAVar4->super_StuntDouble).localIndex_;
              lVar6 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                       ->atomData).position.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                               (pAVar4->super_StuntDouble).storage_);
              local_148 = *(double *)(lVar6 + 0x10 + lVar11 * 0x18);
              pdVar1 = (double *)(lVar6 + lVar11 * 0x18);
              local_158 = *pdVar1;
              dStack_150 = pdVar1[1];
              pAVar4 = pHVar3->donatedHydrogen;
              lVar9 = (long)(pAVar4->super_StuntDouble).localIndex_;
              lVar12 = *(long *)((long)&(((pAVar4->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar4->super_StuntDouble).storage_);
              local_188 = *(double *)(lVar12 + 0x10 + lVar9 * 0x18);
              pdVar1 = (double *)(lVar12 + lVar9 * 0x18);
              local_198 = *pdVar1;
              dStack_190 = pdVar1[1];
              local_f8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar6 + 0x10 + lVar11 * 0x18)
              ;
              pdVar1 = (double *)(lVar6 + lVar11 * 0x18);
              local_f8.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_f8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              local_118.super_Vector<double,_3U>.data_[2] =
                   *(double *)(lVar12 + 0x10 + lVar9 * 0x18);
              pdVar1 = (double *)(lVar12 + lVar9 * 0x18);
              local_118.super_Vector<double,_3U>.data_[0] = *pdVar1;
              local_118.super_Vector<double,_3U>.data_[1] = pdVar1[1];
              local_138.super_Vector<double,_3U>.data_[0] = local_178;
              local_138.super_Vector<double,_3U>.data_[1] = dStack_170;
              local_138.super_Vector<double,_3U>.data_[2] = local_168;
              bVar7 = HBondJump::isHBond(&this->super_HBondJump,&local_f8,&local_118,&local_138);
              if (bVar7) {
                HBondJump::registerHydrogenBond
                          (&this->super_HBondJump,frame,index,iVar2,
                           (local_1c0->super_StuntDouble).globalIndex_);
                local_1b8.super_Vector<double,_3U>.data_[2] = local_188;
                local_1b8.super_Vector<double,_3U>.data_[0] = local_198;
                local_1b8.super_Vector<double,_3U>.data_[1] = dStack_190;
                if ((((this->super_HBondJump).super_TimeCorrFunc<double>.info_)->simParams_->
                    UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01') {
                  Snapshot::wrapVector
                            ((this->super_HBondJump).super_TimeCorrFunc<double>.currentSnapshot_,
                             &local_1b8);
                }
                *(int *)(*(long *)&(this->zbin_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[frame].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + (long)index * 4) =
                     (int)(((local_1b8.super_Vector<double,_3U>.data_[(uint)this->axis_] + local_1d0
                            ) * (double)this->nZBins_) /
                          *(double *)
                           ((long)local_78.super_SquareMatrix<double,_3>.
                                  super_RectMatrix<double,_3U,_3U>.data_ +
                           (ulong)(uint)this->axis_ * 0x20));
              }
              if (ppHVar13 ==
                  (pMVar8->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) break;
              pHVar3 = *ppHVar13;
            }
          }
          pMVar8 = SimInfo::nextMolecule
                             ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1e0);
        }
        ppAVar10 = local_1c8 + 1;
      }
      local_180 = SimInfo::nextMolecule
                            ((this->super_HBondJump).super_TimeCorrFunc<double>.info_,&local_1d8);
    } while (local_180 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJumpZ::findHBonds(int frame) {
    Molecule* mol1;
    Molecule* mol2;
    SimInfo::MoleculeIterator mi, mj;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    Vector3d dPos, hPos, aPos, pos;
    int hInd, index, aInd, zBin;

    Mat3x3d hmat       = currentSnapshot_->getHmat();
    RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

    // Register all the possible HBond donor hydrogens:
    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = registerHydrogen(frame, hInd);
      }
    }

    for (mol1 = info_->beginMolecule(mi); mol1 != NULL;
         mol1 = info_->nextMolecule(mi)) {
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];

        dPos = hbd->donorAtom->getPos();
        hPos = hbd->donatedHydrogen->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            aPos = hba->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aPos = hba->getPos();

        for (mj = mi, mol2 = info_->beginMolecule(mj); mol2 != NULL;
             mol2 = info_->nextMolecule(mj)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd = hbd->donatedHydrogen->getGlobalIndex();
            // no need to register, just look up the index:
            index = GIDtoH_[frame][hInd];

            dPos = hbd->donorAtom->getPos();
            hPos = hbd->donatedHydrogen->getPos();

            if (isHBond(dPos, hPos, aPos)) {
              aInd = hba->getGlobalIndex();
              registerHydrogenBond(frame, index, hInd, aInd);
              pos = hPos;
              if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
                currentSnapshot_->wrapVector(pos);
              zBin =
                  int(nZBins_ * (halfBoxZ_ + pos[axis_]) / hmat(axis_, axis_));
              zbin_[frame][index] = zBin;
            }
          }
        }
      }
    }
  }